

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O2

Graph<Node> * __thiscall
Graph<Node>::operator*(Graph<Node> *__return_storage_ptr__,Graph<Node> *this,Graph<Node> *other)

{
  long lVar1;
  long lVar2;
  Edge *edge;
  long lVar3;
  bool bVar4;
  Edge g2Edge;
  Edge g1Edge;
  Graph<Node> g2;
  Graph<Node> g1;
  
  Graph(&g1,this);
  Graph(&g2,other);
  std::__sort<Edge*,__gnu_cxx::__ops::_Iter_less_iter>(g1.edges.vect,g1.edges.vect + g1.edges._size)
  ;
  std::__sort<Edge*,__gnu_cxx::__ops::_Iter_less_iter>(g2.edges.vect,g2.edges.vect + g2.edges._size)
  ;
  if (g2._nodeCnt < g1._nodeCnt) {
    g2._nodeCnt = g1._nodeCnt;
  }
  Graph(__return_storage_ptr__,g2._nodeCnt);
  for (lVar1 = 0; lVar1 < g1._edgeCnt; lVar1 = lVar1 + 1) {
    lVar2 = 0;
    lVar3 = 8;
    bVar4 = false;
    while ((lVar2 < g2._edgeCnt && (!bVar4))) {
      g1Edge._nodeS = g1.edges.vect[lVar1]._nodeS;
      g1Edge._nodeD = g1.edges.vect[lVar1]._nodeD;
      g1Edge._cost = g1.edges.vect[lVar1]._cost;
      g2Edge._nodeS = *(int *)((long)g2.edges.vect + lVar3 + -8);
      g2Edge._nodeD = *(int *)((long)g2.edges.vect + lVar3 + -4);
      g2Edge._cost = *(int *)((long)&(g2.edges.vect)->_nodeS + lVar3);
      bVar4 = g1Edge._nodeD == g2Edge._nodeD && g1Edge._nodeS == g2Edge._nodeS;
      if (g1Edge._nodeD == g2Edge._nodeD && g1Edge._nodeS == g2Edge._nodeS) {
        edge = &g2Edge;
        if (g1Edge._cost < g2Edge._cost) {
          edge = &g1Edge;
        }
        addEdge(__return_storage_ptr__,edge);
      }
      lVar2 = lVar2 + 1;
      lVar3 = lVar3 + 0xc;
    }
  }
  ~Graph(&g2);
  ~Graph(&g1);
  return __return_storage_ptr__;
}

Assistant:

Graph operator * (const Graph &other) const {
        Graph g1 = *this;
        Graph g2 = other;

        std::sort(g1.edges.begin(), g1.edges.end());
//        g1.edges.mergeSort(0, g1._edgeCnt - 1, [](Edge a, Edge b) {
//            return a < b;
//        });

        std::sort(g2.edges.begin(), g2.edges.end());
//        g2.edges.mergeSort(0, g2._edgeCnt - 1, [](Edge a, Edge b) {
//            return a < b;
//        });

        Graph ans(max(g1.size(), g2.size()));

        for (int i = 0; i < g1.edgeCnt(); ++i) {
            bool added = false;
            for (int j = 0; j < g2.edgeCnt() and !added; ++j) {
                Edge g1Edge = g1.getEdge(i);
                Edge g2Edge = g2.getEdge(j);
                if (g1Edge == g2Edge and g1Edge.getCost() < g2Edge.getCost()) {
                    added = true;
                    ans.addEdge(g1Edge);
                }
                else if (g1Edge == g2Edge) {
                    added = true;
                    ans.addEdge(g2Edge);
                }
            }

//            if (!added) {
//                ans.addEdge(g1.getEdge(i));
//            }
        }

        return ans;
    }